

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O3

void duckdb::GetIntegerIntervalFunctions<duckdb::ToMonthsOperator>(void)

{
  BaseScalarFunction *pBVar1;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  BaseScalarFunction *function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_419;
  LogicalType local_418 [24];
  code *local_400;
  undefined8 local_3f8;
  code *local_3f0;
  code *local_3e8;
  code *local_3e0;
  undefined8 local_3d8;
  code *local_3d0;
  code *local_3c8;
  LogicalType local_3c0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3a8;
  LogicalType local_390 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_378;
  LogicalType local_360 [24];
  LogicalType local_348 [24];
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0 [176];
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_418,INTEGER);
  __l._M_len = 1;
  __l._M_array = local_418;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_378,__l,&local_419);
  duckdb::LogicalType::LogicalType(local_390,INTERVAL);
  local_3d8 = 0;
  local_3e0 = ScalarFunction::UnaryFunction<int,duckdb::interval_t,duckdb::ToMonthsOperator>;
  local_3c8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_3d0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_348,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_208,&local_378,local_390,&local_3e0,0,0,0,0,local_348,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_208);
  local_208._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_208 + 0xb0U),(_Any_data *)((long)&local_208 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_348);
  if (local_3d0 != (code *)0x0) {
    (*local_3d0)(&local_3e0,&local_3e0,3);
  }
  duckdb::LogicalType::~LogicalType(local_390);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_378);
  duckdb::LogicalType::~LogicalType(local_418);
  duckdb::LogicalType::LogicalType(local_418,BIGINT);
  __l_00._M_len = 1;
  __l_00._M_array = local_418;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3a8,__l_00,&local_419);
  duckdb::LogicalType::LogicalType(local_3c0,INTERVAL);
  local_3f8 = 0;
  local_400 = ScalarFunction::UnaryFunction<long,duckdb::interval_t,duckdb::ToMonthsOperator>;
  local_3e8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_3f0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_360,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_330,&local_3a8,local_3c0,&local_400,0,0,0,0,local_360,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_330);
  local_330._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_330 + 0xb0U),(_Any_data *)((long)&local_330 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_360);
  if (local_3f0 != (code *)0x0) {
    (*local_3f0)(&local_400,&local_400,3);
  }
  duckdb::LogicalType::~LogicalType(local_3c0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3a8);
  duckdb::LogicalType::~LogicalType(local_418);
  function = *(BaseScalarFunction **)(in_RDI + 0x20);
  pBVar1 = *(BaseScalarFunction **)(in_RDI + 0x28);
  if (function != pBVar1) {
    do {
      BaseScalarFunction::SetReturnsError(local_e0,function);
      duckdb::BaseScalarFunction::~BaseScalarFunction(local_e0);
      function = function + 0x128;
    } while (function != pBVar1);
  }
  return;
}

Assistant:

ScalarFunctionSet GetIntegerIntervalFunctions() {
	ScalarFunctionSet function_set;
	function_set.AddFunction(ScalarFunction({LogicalType::INTEGER}, LogicalType::INTERVAL,
	                                        ScalarFunction::UnaryFunction<int32_t, interval_t, OP>));
	function_set.AddFunction(ScalarFunction({LogicalType::BIGINT}, LogicalType::INTERVAL,
	                                        ScalarFunction::UnaryFunction<int64_t, interval_t, OP>));
	for (auto &func : function_set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return function_set;
}